

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSBuilder::addTable(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  long lVar1;
  Name name_00;
  size_t sVar2;
  pointer pNVar3;
  bool bVar4;
  int32_t iVar5;
  Value *pVVar6;
  undefined7 extraout_var;
  Ref RVar7;
  Ref RVar8;
  Ref RVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar10;
  Name *name;
  undefined1 auVar11 [8];
  Ref in_R8;
  uint uVar12;
  ulong uVar13;
  Name name_01;
  IString name_02;
  IString target;
  IString target_00;
  IString name_03;
  IString name_04;
  IString name_05;
  IString name_06;
  IString op;
  IString op_00;
  string_view sVar14;
  IString IVar15;
  undefined1 local_268 [8];
  FlatTable flat;
  string local_e0;
  IString local_c0;
  IString local_b0;
  size_t local_a0;
  char *local_98;
  Value *local_90;
  Value *local_88;
  long local_80;
  Value *local_78;
  char *local_70;
  Wasm2JSBuilder *local_68;
  Literal *local_60;
  Value *local_58;
  Ref local_50;
  Value *local_48;
  Module *local_40;
  uint local_34;
  
  if ((wasm->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (wasm->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_68 = this;
    local_58 = ast.inst;
    local_40 = wasm;
    local_50 = cashew::ValueBuilder::makeArray();
    pVVar6 = (Value *)(local_40->tables).
                      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    local_78 = (Value *)(local_40->tables).
                        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    local_34 = 0;
    RVar8.inst = pVVar6;
    while (pVVar6 != local_78) {
      bVar4 = Type::isFunction((Type *)(*(long *)pVVar6 + 0x50));
      if (!bVar4) {
        Fatal::Fatal((Fatal *)local_268);
        Fatal::operator<<((Fatal *)local_268,
                          (char (*) [45])"wasm2js doesn\'t support non-function tables\n");
LAB_0014b054:
        Fatal::~Fatal((Fatal *)local_268);
      }
      local_48 = pVVar6;
      if (((*(Table **)pVVar6)->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        TableUtils::FlatTable::FlatTable((FlatTable *)local_268,local_40,*(Table **)pVVar6);
        pNVar3 = flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start;
        auVar11 = local_268;
        if ((char)flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == '\x01') {
          for (; pcVar10 = UINT32ARRAY, auVar11 != (undefined1  [8])pNVar3;
              auVar11 = (undefined1  [8])((long)auVar11 + 0x10)) {
            if (((string_view *)auVar11)->_M_str == (char *)0x0) {
              ((string_view *)auVar11)->_M_len = NULL_;
              ((string_view *)auVar11)->_M_str = pcVar10;
              sVar14 = *(string_view *)auVar11;
            }
            else {
              name_01.super_IString.str._M_str = ((string_view *)auVar11)->_M_str;
              name_01.super_IString.str._M_len = ((string_view *)auVar11)->_M_len;
              sVar14 = (string_view)fromName(local_68,name_01,Top);
              *(string_view *)auVar11 = sVar14;
            }
            name_02.str._M_str = sVar14._M_str;
            name_02.str._M_len = (size_t)name_02.str._M_str;
            RVar8 = cashew::ValueBuilder::makeName((ValueBuilder *)sVar14._M_len,name_02);
            cashew::ValueBuilder::appendToArray(local_50,RVar8);
          }
        }
        else {
          RVar7 = cashew::ValueBuilder::makeInt(*(uint32_t *)(*(long *)local_48 + 0x38));
          IString::IString(&local_c0,"Array");
          target.str._M_str = (char *)RVar7.inst;
          target.str._M_len = (size_t)local_c0.str._M_str;
          RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>
                            ((ValueBuilder *)local_c0.str._M_len,target,RVar8);
          local_50 = cashew::ValueBuilder::makeNew(RVar8);
          local_34 = (uint)CONCAT71((int7)((ulong)local_50.inst >> 8),1);
        }
        std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                  ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)local_268);
      }
      else {
        local_34 = (uint)CONCAT71(extraout_var,1);
      }
      bVar4 = isTableExported(local_40);
      RVar8.inst = *(Value **)(*(long *)local_48 + 0x20);
      if (bVar4) {
        if (RVar8.inst != (Value *)0x0) {
          Fatal::Fatal((Fatal *)local_268);
          Fatal::operator<<((Fatal *)local_268,
                            (char (*) [68])
                            "wasm2js doesn\'t support a table that is both imported and exported\n")
          ;
          goto LAB_0014b054;
        }
        RVar7 = cashew::ValueBuilder::makeVar(false);
        cashew::Value::push_back(local_58,RVar7);
        IString::IString(&local_b0,"Table");
        target_00.str._M_str = (char *)local_50.inst;
        target_00.str._M_len = (size_t)local_b0.str._M_str;
        RVar8 = cashew::ValueBuilder::makeCall<cashew::Ref>
                          ((ValueBuilder *)local_b0.str._M_len,target_00,RVar8);
LAB_0014adc7:
        name_06.str._M_str = (char *)RVar8.inst;
        name_06.str._M_len = _isalnum;
        cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar7.inst,FUNCTION_TABLE,name_06,in_R8);
      }
      else if (RVar8.inst == (Value *)0x0) {
        RVar7 = cashew::ValueBuilder::makeVar(false);
        cashew::Value::push_back(local_58,RVar7);
        RVar8.inst = local_50.inst;
        goto LAB_0014adc7;
      }
      if ((local_34 & 1) != 0) {
        local_80 = *(long *)(*(long *)local_48 + 8);
        if (local_80 == 0) {
          __assert_fail("table.is() && \"Table name must not be null\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                        ,0x85,
                        "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h:723:29)]"
                       );
        }
        local_88 = (Value *)(local_40->elementSegments).
                            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
        RVar8.inst = (Value *)(local_40->elementSegments).
                              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
        while (RVar8.inst != local_88) {
          lVar1 = *(long *)RVar8.inst;
          local_90 = RVar8.inst;
          if (*(long *)(lVar1 + 0x20) == local_80) {
            local_70 = *(char **)(lVar1 + 0x28);
            bVar4 = Type::isFunction((Type *)(lVar1 + 0x30));
            if (bVar4) {
              local_60 = (Literal *)(local_70 + 0x10);
              uVar12 = 0;
              while( true ) {
                uVar13 = (ulong)uVar12;
                if ((ulong)(*(long *)(lVar1 + 0x40) - *(long *)(lVar1 + 0x38) >> 3) <= uVar13)
                break;
                pcVar10 = *(char **)(*(long *)(lVar1 + 0x38) + uVar13 * 8);
                if (*pcVar10 == '+') {
                  local_a0 = *(size_t *)(pcVar10 + 0x10);
                  local_98 = *(char **)(pcVar10 + 0x18);
                  if (*local_70 == '\n') {
                    IString::toString_abi_cxx11_(&local_e0,(IString *)local_60);
                    ::wasm::asmangle((string *)local_268,&local_e0);
                    IVar15 = stringToIString((string *)local_268);
                    name_03.str._M_str = IVar15.str._M_str;
                    name_03.str._M_len = (size_t)name_03.str._M_str;
                    RVar7 = cashew::ValueBuilder::makeName
                                      ((ValueBuilder *)IVar15.str._M_len,name_03);
                    sVar2 = ___cxa_end_catch;
                    RVar8.inst = cashew::PLUS.inst;
                    RVar9 = cashew::ValueBuilder::makeDouble((double)uVar13);
                    op.str._M_str = (char *)RVar9.inst;
                    op.str._M_len = sVar2;
                    RVar8 = cashew::ValueBuilder::makeBinary(RVar7.inst,RVar8,op,in_R8);
                    std::__cxx11::string::~string((string *)local_268);
                    std::__cxx11::string::~string((string *)&local_e0);
                    pcVar10 = extraout_RDX_00;
                  }
                  else {
                    if (*local_70 != '\x0e') {
                      ::wasm::handle_unreachable
                                ("unexpected expr type",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                                 ,0x2e1);
                    }
                    iVar5 = Literal::geti32(local_60);
                    RVar8 = cashew::ValueBuilder::makeInt(uVar12 + iVar5);
                    pcVar10 = extraout_RDX;
                  }
                  name_04.str._M_str = pcVar10;
                  name_04.str._M_len = _isalnum;
                  RVar7 = cashew::ValueBuilder::makeName(FUNCTION_TABLE.inst,name_04);
                  RVar7 = cashew::ValueBuilder::makeSub(RVar7,RVar8);
                  sVar2 = BLOCK;
                  RVar8.inst = cashew::SET.inst;
                  name_00.super_IString.str._M_str = local_98;
                  name_00.super_IString.str._M_len = local_a0;
                  IVar15 = fromName(local_68,name_00,Top);
                  name_05.str._M_str = IVar15.str._M_str;
                  name_05.str._M_len = (size_t)name_05.str._M_str;
                  RVar9 = cashew::ValueBuilder::makeName((ValueBuilder *)IVar15.str._M_len,name_05);
                  op_00.str._M_str = (char *)RVar9.inst;
                  op_00.str._M_len = sVar2;
                  RVar8 = cashew::ValueBuilder::makeBinary(RVar7.inst,RVar8,op_00,in_R8);
                  cashew::Value::push_back(local_58,RVar8);
                }
                uVar12 = uVar12 + 1;
              }
            }
          }
          RVar8.inst = (Value *)&local_90->field_1;
        }
      }
      pVVar6 = (Value *)&local_48->field_1;
    }
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addTable(Ref ast, Module* wasm) {
  if (wasm->tables.size() == 0) {
    return;
  }

  bool perElementInit = false;

  // Emit a simple flat table as a JS array literal. Otherwise,
  // emit assignments separately for each index.
  Ref theArray = ValueBuilder::makeArray();
  for (auto& table : wasm->tables) {
    if (!table->type.isFunction()) {
      Fatal() << "wasm2js doesn't support non-function tables\n";
    }

    if (!table->imported()) {
      TableUtils::FlatTable flat(*wasm, *table);
      if (flat.valid) {
        for (auto& name : flat.names) {
          if (name.is()) {
            name = fromName(name, NameScope::Top);
          } else {
            name = NULL_;
          }
          ValueBuilder::appendToArray(theArray, ValueBuilder::makeName(name));
        }
      } else {
        perElementInit = true;
        Ref initial =
          ValueBuilder::makeInt(Address::address32_t(table->initial.addr));
        theArray = ValueBuilder::makeNew(
          ValueBuilder::makeCall(IString("Array"), initial));
      }
    } else {
      perElementInit = true;
    }

    if (isTableExported(*wasm)) {
      // If the table is exported use a fake WebAssembly.Table object
      // We don't handle the case where a table is both imported and exported.
      if (table->imported()) {
        Fatal() << "wasm2js doesn't support a table that is both imported and "
                   "exported\n";
      }
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);

      Ref table = ValueBuilder::makeCall(IString("Table"), theArray);
      ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, table);
    } else if (!table->imported()) {
      // Otherwise if the table is internal (neither imported not exported).
      // Just use a plain array in this case, avoiding the Table.
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);
      ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, theArray);
    }

    if (perElementInit) {
      // TODO: optimize for size
      ModuleUtils::iterTableSegments(
        *wasm, table->name, [&](ElementSegment* segment) {
          auto offset = segment->offset;
          ElementUtils::iterElementSegmentFunctionNames(
            segment, [&](Name entry, Index i) {
              Ref index;
              if (auto* c = offset->dynCast<Const>()) {
                index = ValueBuilder::makeInt(c->value.geti32() + i);
              } else if (auto* get = offset->dynCast<GlobalGet>()) {
                index = ValueBuilder::makeBinary(
                  ValueBuilder::makeName(
                    stringToIString(asmangle(get->name.toString()))),
                  PLUS,
                  ValueBuilder::makeNum(i));
              } else {
                WASM_UNREACHABLE("unexpected expr type");
              }
              ast->push_back(
                ValueBuilder::makeStatement(ValueBuilder::makeBinary(
                  ValueBuilder::makeSub(ValueBuilder::makeName(FUNCTION_TABLE),
                                        index),
                  SET,
                  ValueBuilder::makeName(fromName(entry, NameScope::Top)))));
            });
        });
    }
  }
}